

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

SupportVectorRegressor * __thiscall
CoreML::Specification::Model::mutable_supportvectorregressor(Model *this)

{
  bool bVar1;
  SupportVectorRegressor *this_00;
  Model *this_local;
  
  bVar1 = has_supportvectorregressor(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_supportvectorregressor(this);
    this_00 = (SupportVectorRegressor *)operator_new(0x38);
    SupportVectorRegressor::SupportVectorRegressor(this_00);
    (this->Type_).supportvectorregressor_ = this_00;
  }
  return (SupportVectorRegressor *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::SupportVectorRegressor* Model::mutable_supportvectorregressor() {
  if (!has_supportvectorregressor()) {
    clear_Type();
    set_has_supportvectorregressor();
    Type_.supportvectorregressor_ = new ::CoreML::Specification::SupportVectorRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.supportVectorRegressor)
  return Type_.supportvectorregressor_;
}